

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O2

void __thiscall
QFusionStyle::drawItemText
          (QFusionStyle *this,QPainter *painter,QRect *rect,int alignment,QPalette *pal,bool enabled
          ,QString *text,ColorRole textRole)

{
  long lVar1;
  QPen *pQVar2;
  QBrush *pQVar3;
  long in_FS_OFFSET;
  double dVar4;
  QPen aQStack_48 [8];
  QPen savedPen;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((text->d).size != 0) {
    _savedPen = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = (QPen *)QPainter::pen();
    QPen::QPen(&savedPen,pQVar2);
    if (textRole != NoRole) {
      pQVar3 = QPalette::brush(pal,textRole);
      dVar4 = (double)QPen::widthF();
      QPen::QPen(aQStack_48,pQVar3,dVar4,SolidLine,SquareCap,BevelJoin);
      QPainter::setPen((QPen *)painter);
      QPen::~QPen(aQStack_48);
    }
    QPainter::drawText((QRect *)painter,(int)rect,(QString *)(ulong)(uint)alignment,(QRect *)text);
    QPainter::setPen((QPen *)painter);
    QPen::~QPen(&savedPen);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFusionStyle::drawItemText(QPainter *painter, const QRect &rect, int alignment, const QPalette &pal,
                                bool enabled, const QString& text, QPalette::ColorRole textRole) const
{
    Q_UNUSED(enabled);
    if (text.isEmpty())
        return;

    QPen savedPen = painter->pen();
    if (textRole != QPalette::NoRole)
        painter->setPen(QPen(pal.brush(textRole), savedPen.widthF()));
    painter->drawText(rect, alignment, text);
    painter->setPen(savedPen);
}